

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall leveldb::Block::Block(Block *this,BlockContents *contents)

{
  long lVar1;
  uint32_t uVar2;
  char *pcVar3;
  size_t sVar4;
  long in_RSI;
  Block *in_RDI;
  long in_FS_OFFSET;
  size_t max_restarts_allowed;
  Slice *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = Slice::data(in_stack_ffffffffffffffc8);
  in_RDI->data_ = pcVar3;
  sVar4 = Slice::size(in_stack_ffffffffffffffc8);
  in_RDI->size_ = sVar4;
  in_RDI->owned_ = (bool)(*(byte *)(in_RSI + 0x11) & 1);
  if (in_RDI->size_ < 4) {
    in_RDI->size_ = 0;
  }
  else {
    sVar4 = in_RDI->size_;
    uVar2 = NumRestarts(in_RDI);
    if (sVar4 - 4 >> 2 < (ulong)uVar2) {
      in_RDI->size_ = 0;
    }
    else {
      sVar4 = in_RDI->size_;
      uVar2 = NumRestarts(in_RDI);
      in_RDI->restart_offset_ = (int)sVar4 + (uVar2 + 1) * -4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Block::Block(const BlockContents& contents)
    : data_(contents.data.data()),
      size_(contents.data.size()),
      owned_(contents.heap_allocated) {
  if (size_ < sizeof(uint32_t)) {
    size_ = 0;  // Error marker
  } else {
    size_t max_restarts_allowed = (size_ - sizeof(uint32_t)) / sizeof(uint32_t);
    if (NumRestarts() > max_restarts_allowed) {
      // The size is too small for NumRestarts()
      size_ = 0;
    } else {
      restart_offset_ = size_ - (1 + NumRestarts()) * sizeof(uint32_t);
    }
  }
}